

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_53533::ParserImpl::IsMainExp(ParserImpl *this,TokenDetail *t)

{
  int iVar1;
  bool local_15;
  int token;
  TokenDetail *t_local;
  ParserImpl *this_local;
  
  iVar1 = t->token_;
  local_15 = true;
  if ((((((iVar1 != 0x10c) && (local_15 = true, iVar1 != 0x106)) &&
        (local_15 = true, iVar1 != 0x112)) &&
       ((local_15 = true, iVar1 != 0x117 && (local_15 = true, iVar1 != 0x116)))) &&
      ((local_15 = true, iVar1 != 0x11d &&
       ((local_15 = true, iVar1 != 0x108 && (local_15 = true, iVar1 != 0x115)))))) &&
     (local_15 = true, iVar1 != 0x28)) {
    local_15 = iVar1 == 0x7b;
  }
  return local_15;
}

Assistant:

bool IsMainExp(const TokenDetail &t) const
        {
            int token = t.token_;
            return
                token == Token_Nil ||
                token == Token_False ||
                token == Token_True ||
                token == Token_Number ||
                token == Token_String ||
                token == Token_VarArg ||
                token == Token_Function ||
                token == Token_Id ||
                token == '(' ||
                token == '{';
        }